

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

gs_val_t * gs_eval_expr(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_expr_t *expr)

{
  undefined8 *puVar1;
  gs_val_type *pgVar2;
  char cVar3;
  gs_expr_type gVar4;
  gs_expr_t *pgVar5;
  char *pcVar6;
  map_node_t *pmVar7;
  gs_val_t val_00;
  gs_val_t val_01;
  gs_val_t val_02;
  gs_val_t val_03;
  gs_val_t val_04;
  gs_val_t val_05;
  gs_val_t val_06;
  gs_val_t val_07;
  gs_val_t val_08;
  gs_val_t val_09;
  gs_val_t val_10;
  gs_val_t val_11;
  gs_val_t val_12;
  gs_val_t val_13;
  gs_val_t val_14;
  gs_val_t val_15;
  gs_val_t val_16;
  gs_val_t val_17;
  gs_val_t val_18;
  gs_val_t val_19;
  gs_val_t val_20;
  gs_val_t val_21;
  gs_val_t val_22;
  gs_val_t val_23;
  gs_val_t val_24;
  gs_val_t val_25;
  gs_val_t val_26;
  gs_val_t val_27;
  gs_val_t val_28;
  gs_val_t val_29;
  gs_val_t val_30;
  gs_val_t val_31;
  gs_val_t val_32;
  gs_val_t val_33;
  gs_val_t val_34;
  gs_val_t val_35;
  gs_val_t val_36;
  gs_val_t val_37;
  gs_val_t val_38;
  gs_val_t val_39;
  gs_val_t val_40;
  gs_val_t val_41;
  gs_val_t val_42;
  gs_val_t val_43;
  gs_val_t val_44;
  gs_val_t val_45;
  vec2 vVar8;
  char **data;
  vec2 v1;
  vec2 v2;
  vec2 v2_00;
  int iVar9;
  gs_val_type gVar10;
  int iVar11;
  map_node_t **ppmVar12;
  vec2 vVar13;
  golf_string_t *str;
  map_base_t *pmVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int *piVar18;
  anon_union_32_11_85719a42_for_gs_expr_2 *paVar19;
  gs_eval_t *pgVar20;
  char *pcVar21;
  map_node_t **unaff_R12;
  undefined1 uVar22;
  int i;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  undefined4 uVar28;
  gs_val_type gVar29;
  vec3 vVar30;
  vec3 v1_00;
  vec3 v1_01;
  vec3 v2_01;
  vec3 v2_02;
  undefined8 uVar31;
  undefined8 in_stack_ffffffffffffff10;
  gs_val_t left_val;
  gs_val_t right_val;
  gs_val_t val;
  gs_val_t val_1;
  vec2 local_68;
  gs_val_t right_val_1;
  
  switch(expr->type) {
  case GS_EXPR_BINARY_OP:
    gs_eval_expr(&left_val,eval,(expr->field_2).binary_op.left);
    if (left_val.is_return == true) {
      val.field_2._8_8_ = CONCAT44(left_val.field_2._12_4_,left_val.field_2.vec3_val.z);
      right_val._5_2_ = left_val._5_2_;
      right_val.is_return = true;
      right_val._7_1_ = left_val._7_1_;
LAB_0013560c:
      val.is_return = right_val.is_return;
      val._5_2_ = right_val._5_2_;
      val._7_1_ = right_val._7_1_;
      val.field_2.field10[4] = SUB41(left_val.field_2.vec2_val.y,0);
      val.field_2._5_2_ = (undefined2)((uint)left_val.field_2.vec2_val.y >> 8);
      val.field_2.field10[7] = (undefined1)((uint)left_val.field_2.vec2_val.y >> 0x18);
      val.type = left_val.type;
      val.field_2.int_val = left_val.field_2.int_val;
      goto switchD_0013576b_default;
    }
    gs_eval_expr(&right_val,eval,(expr->field_2).binary_op.right);
    bVar25 = right_val.is_return == true;
    if (bVar25) {
      val.field_2._8_8_ = CONCAT44(right_val.field_2._12_4_,right_val.field_2.vec3_val.z);
      left_val.type = right_val.type;
      left_val.field_2.int_val = right_val.field_2.int_val;
      left_val.field_2.vec2_val.y = right_val.field_2.vec2_val.y;
      goto LAB_0013560c;
    }
    uVar28 = left_val.field_2.vec3_val.z;
    switch((expr->field_2).int_val) {
    case 0:
      if (right_val.type == GS_VAL_INT && (left_val.type ^ GS_VAL_INT) == GS_VAL_VOID) {
        val_06.field_2._4_4_ = left_val.field_2._12_4_;
        val_06.field_2.int_val = left_val.field_2._8_4_;
        val_06._4_4_ = left_val.field_2.vec2_val.y;
        val_06.type = left_val.field_2.int_val;
        val_06.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar9 = gs_val_to_int(val_06);
        val_07.field_2._4_4_ = right_val.field_2._12_4_;
        val_07.field_2.int_val = right_val.field_2._8_4_;
        val_07._4_4_ = right_val.field_2.vec2_val.y;
        val_07.type = right_val.field_2.int_val;
        val_07.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar11 = gs_val_to_int(val_07);
        val.field_2.int_val = iVar11 + iVar9;
        goto LAB_00135f2f;
      }
      if (((left_val.type ^ GS_VAL_INT) == GS_VAL_VOID && right_val.type == GS_VAL_FLOAT) ||
         ((right_val.type & ~GS_VAL_BOOL) == GS_VAL_INT && left_val.type == GS_VAL_FLOAT)) {
        val_32.field_2._4_4_ = left_val.field_2._12_4_;
        val_32.field_2.int_val = left_val.field_2._8_4_;
        val_32._4_4_ = left_val.field_2.vec2_val.y;
        val_32.type = left_val.field_2.int_val;
        val_32.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar26 = gs_val_to_float(val_32);
        val_33.field_2._4_4_ = right_val.field_2._12_4_;
        val_33.field_2.int_val = right_val.field_2._8_4_;
        val_33._4_4_ = right_val.field_2.vec2_val.y;
        val_33.type = right_val.field_2.int_val;
        val_33.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar27 = gs_val_to_float(val_33);
        val.field_2.float_val = fVar27 + fVar26;
LAB_001363bc:
        val.type = GS_VAL_FLOAT;
        val.is_return = false;
      }
      else {
        v2.y = right_val.field_2.vec2_val.y;
        v2.x = right_val.field_2.float_val;
        v1.y = left_val.field_2.vec2_val.y;
        v1.x = left_val.field_2.float_val;
        if (right_val.type == GS_VAL_VEC2 && left_val.type == GS_VAL_VEC2) {
          vVar13 = vec2_add(v1,v2);
          val.field_2.int_val = (int)vVar13.x;
          fVar26 = vVar13.y;
LAB_001367ab:
          val.type = GS_VAL_VEC2;
          val.is_return = false;
          val.field_2.field10[4] = SUB41(fVar26,0);
          val.field_2._5_2_ = (undefined2)((uint)fVar26 >> 8);
          val.field_2.field10[7] = (undefined1)((uint)fVar26 >> 0x18);
        }
        else {
          if (right_val.type == GS_VAL_VEC3 && left_val.type == GS_VAL_VEC3) {
            v1_00.z = left_val.field_2.vec3_val.z;
            v1_00.x = left_val.field_2.float_val;
            v1_00.y = left_val.field_2._4_4_;
            v2_01.z = right_val.field_2.vec3_val.z;
            v2_01.x = right_val.field_2.float_val;
            v2_01.y = right_val.field_2._4_4_;
            vVar30 = vec3_add(v1_00,v2_01);
            val.field_2.vec3_val.z = vVar30.z;
            val.field_2.int_val = (int)vVar30.x;
            fVar26 = vVar30.y;
            goto LAB_00136976;
          }
          pcVar21 = "Unable to add these types";
LAB_00136a2f:
          gs_val_error(&val,pcVar21);
        }
      }
      break;
    case 1:
      if (right_val.type == GS_VAL_INT && (left_val.type ^ GS_VAL_INT) == GS_VAL_VOID) {
        val_16.field_2._4_4_ = left_val.field_2._12_4_;
        val_16.field_2.int_val = left_val.field_2._8_4_;
        val_16._4_4_ = left_val.field_2.vec2_val.y;
        val_16.type = left_val.field_2.int_val;
        val_16.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar9 = gs_val_to_int(val_16);
        val_17.field_2._4_4_ = right_val.field_2._12_4_;
        val_17.field_2.int_val = right_val.field_2._8_4_;
        val_17._4_4_ = right_val.field_2.vec2_val.y;
        val_17.type = right_val.field_2.int_val;
        val_17.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar11 = gs_val_to_int(val_17);
        val.field_2.int_val = iVar9 - iVar11;
        val.type = GS_VAL_INT;
        val.is_return = false;
      }
      else {
        if (((left_val.type ^ GS_VAL_INT) != GS_VAL_VOID || right_val.type != GS_VAL_FLOAT) &&
           ((right_val.type & ~GS_VAL_BOOL) != GS_VAL_INT || left_val.type != GS_VAL_FLOAT)) {
          v2_00.y = right_val.field_2.vec2_val.y;
          v2_00.x = right_val.field_2.float_val;
          vVar13.y = left_val.field_2.vec2_val.y;
          vVar13.x = left_val.field_2.float_val;
          if (right_val.type == GS_VAL_VEC2 && left_val.type == GS_VAL_VEC2) {
            vVar13 = vec2_sub(vVar13,v2_00);
            val.field_2.int_val = (int)vVar13.x;
            fVar26 = vVar13.y;
            goto LAB_001367ab;
          }
          if (right_val.type != GS_VAL_VEC3 || left_val.type != GS_VAL_VEC3) {
            pcVar21 = "Unable to subtract these types";
            goto LAB_00136a2f;
          }
          v1_01.z = left_val.field_2.vec3_val.z;
          v1_01.x = left_val.field_2.float_val;
          v1_01.y = left_val.field_2._4_4_;
          v2_02.z = right_val.field_2.vec3_val.z;
          v2_02.x = right_val.field_2.float_val;
          v2_02.y = right_val.field_2._4_4_;
          vVar30 = vec3_sub(v1_01,v2_02);
          val.field_2.vec3_val.z = vVar30.z;
          val.field_2.int_val = (int)vVar30.x;
          fVar26 = vVar30.y;
          goto LAB_00136976;
        }
        val_34.field_2._4_4_ = left_val.field_2._12_4_;
        val_34.field_2.int_val = left_val.field_2._8_4_;
        val_34._4_4_ = left_val.field_2.vec2_val.y;
        val_34.type = left_val.field_2.int_val;
        val_34.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar26 = gs_val_to_float(val_34);
        val_35.field_2._4_4_ = right_val.field_2._12_4_;
        val_35.field_2.int_val = right_val.field_2._8_4_;
        val_35._4_4_ = right_val.field_2.vec2_val.y;
        val_35.type = right_val.field_2.int_val;
        val_35.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar27 = gs_val_to_float(val_35);
        val.field_2.float_val = fVar26 - fVar27;
LAB_00136438:
        val.type = GS_VAL_FLOAT;
        val.is_return = false;
      }
      break;
    case 2:
      if (right_val.type == GS_VAL_INT && (left_val.type ^ GS_VAL_INT) == GS_VAL_VOID) {
        val_10.field_2._4_4_ = left_val.field_2._12_4_;
        val_10.field_2.int_val = left_val.field_2._8_4_;
        val_10._4_4_ = left_val.field_2.vec2_val.y;
        val_10.type = left_val.field_2.int_val;
        val_10.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar9 = gs_val_to_int(val_10);
        val_11.field_2._4_4_ = right_val.field_2._12_4_;
        val_11.field_2.int_val = right_val.field_2._8_4_;
        val_11._4_4_ = right_val.field_2.vec2_val.y;
        val_11.type = right_val.field_2.int_val;
        val_11.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar11 = gs_val_to_int(val_11);
        val.field_2.int_val = iVar11 * iVar9;
        goto LAB_00135f2f;
      }
      if (((left_val.type ^ GS_VAL_INT) == GS_VAL_VOID && right_val.type == GS_VAL_FLOAT) ||
         (gVar10 = right_val.type & ~GS_VAL_BOOL ^ GS_VAL_INT,
         left_val.type == GS_VAL_FLOAT && gVar10 == GS_VAL_VOID)) {
        val_26.field_2._4_4_ = left_val.field_2._12_4_;
        val_26.field_2.int_val = left_val.field_2._8_4_;
        val_26._4_4_ = left_val.field_2.vec2_val.y;
        val_26.type = left_val.field_2.int_val;
        val_26.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar26 = gs_val_to_float(val_26);
        val_27.field_2._4_4_ = right_val.field_2._12_4_;
        val_27.field_2.int_val = right_val.field_2._8_4_;
        val_27._4_4_ = right_val.field_2.vec2_val.y;
        val_27.type = right_val.field_2.int_val;
        val_27.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar27 = gs_val_to_float(val_27);
        val.field_2.float_val = fVar27 * fVar26;
        goto LAB_001363bc;
      }
      local_68.y = left_val.field_2.vec2_val.y;
      local_68.x = left_val.field_2.float_val;
      if (left_val.type == GS_VAL_VEC2 && gVar10 == GS_VAL_VOID) {
        uVar31 = CONCAT44(right_val.field_2._12_4_,right_val.field_2.vec3_val.z);
LAB_001366f8:
        val_42._4_4_ = right_val.field_2.vec2_val.y;
        val_42.type = right_val.field_2.int_val;
        val_42.field_2._0_4_ = (float)(int)uVar31;
        val_42.field_2._4_4_ = (float)(int)((ulong)uVar31 >> 0x20);
        val_42.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar26 = gs_val_to_float(val_42);
LAB_00136745:
        vVar13 = vec2_scale(local_68,fVar26);
        val.field_2.int_val = (int)vVar13.x;
        fVar26 = vVar13.y;
        goto LAB_001367ab;
      }
      if (left_val.type != GS_VAL_VEC3 || gVar10 != GS_VAL_VOID) {
        local_68.y = right_val.field_2.vec2_val.y;
        local_68.x = right_val.field_2.float_val;
        right_val.field_2.int_val = left_val.field_2.int_val;
        right_val.field_2.vec2_val.y = left_val.field_2.vec2_val.y;
        if (right_val.type == GS_VAL_VEC3) {
          if ((left_val.type & ~GS_VAL_BOOL) == GS_VAL_INT) {
            uVar31 = CONCAT44(left_val.field_2._12_4_,left_val.field_2.vec3_val.z);
            uVar28 = right_val.field_2.vec3_val.z;
            goto LAB_001368d2;
          }
        }
        else if ((right_val.type == GS_VAL_VEC2) && ((left_val.type & ~GS_VAL_BOOL) == GS_VAL_INT))
        {
          uVar31 = CONCAT44(left_val.field_2._12_4_,left_val.field_2.vec3_val.z);
          goto LAB_001366f8;
        }
        pcVar21 = "Unable to multiply these types";
        goto LAB_00136a2f;
      }
      uVar31 = CONCAT44(right_val.field_2._12_4_,right_val.field_2.vec3_val.z);
LAB_001368d2:
      val_44._4_4_ = right_val.field_2.vec2_val.y;
      val_44.type = right_val.field_2.int_val;
      val_44.field_2._0_4_ = (float)(int)uVar31;
      val_44.field_2._4_4_ = (float)(int)((ulong)uVar31 >> 0x20);
      val_44.field_2._8_8_ = in_stack_ffffffffffffff10;
      fVar26 = gs_val_to_float(val_44);
LAB_0013691e:
      vVar30.z = (float)uVar28;
      vVar30.x = local_68.x;
      vVar30.y = local_68.y;
      vVar30 = vec3_scale(vVar30,fVar26);
      val.field_2.vec3_val.z = vVar30.z;
      val.field_2.int_val = (int)vVar30.x;
      fVar26 = vVar30.y;
LAB_00136976:
      val.type = GS_VAL_VEC3;
      val.is_return = false;
      val.field_2.field10[4] = SUB41(fVar26,0);
      val.field_2._5_2_ = (undefined2)((uint)fVar26 >> 8);
      val.field_2.field10[7] = (undefined1)((uint)fVar26 >> 0x18);
      break;
    case 3:
      if (right_val.type != GS_VAL_INT || (left_val.type ^ GS_VAL_INT) != GS_VAL_VOID) {
        if (((left_val.type ^ GS_VAL_INT) == GS_VAL_VOID && right_val.type == GS_VAL_FLOAT) ||
           (gVar10 = right_val.type & ~GS_VAL_BOOL ^ GS_VAL_INT,
           left_val.type == GS_VAL_FLOAT && gVar10 == GS_VAL_VOID)) {
          val_28.field_2._4_4_ = left_val.field_2._12_4_;
          val_28.field_2.int_val = left_val.field_2._8_4_;
          val_28._4_4_ = left_val.field_2.vec2_val.y;
          val_28.type = left_val.field_2.int_val;
          val_28.field_2._8_8_ = in_stack_ffffffffffffff10;
          fVar26 = gs_val_to_float(val_28);
          val_29.field_2._4_4_ = right_val.field_2._12_4_;
          val_29.field_2.int_val = right_val.field_2._8_4_;
          val_29._4_4_ = right_val.field_2.vec2_val.y;
          val_29.type = right_val.field_2.int_val;
          val_29.field_2._8_8_ = in_stack_ffffffffffffff10;
          fVar27 = gs_val_to_float(val_29);
          val.field_2.float_val = fVar26 / fVar27;
          goto LAB_00136438;
        }
        local_68.y = left_val.field_2.vec2_val.y;
        local_68.x = left_val.field_2.float_val;
        if (left_val.type == GS_VAL_VEC2 && gVar10 == GS_VAL_VOID) {
          val_43.field_2._4_4_ = right_val.field_2._12_4_;
          val_43.field_2.int_val = right_val.field_2._8_4_;
          val_43._4_4_ = right_val.field_2.vec2_val.y;
          val_43.type = right_val.field_2.int_val;
          val_43.field_2._8_8_ = in_stack_ffffffffffffff10;
          fVar26 = gs_val_to_float(val_43);
          fVar26 = 1.0 / fVar26;
          goto LAB_00136745;
        }
        if (left_val.type != GS_VAL_VEC3 || gVar10 != GS_VAL_VOID) {
          pcVar21 = "Unable to divide these types";
          goto LAB_00136a2f;
        }
        val_45.field_2._4_4_ = right_val.field_2._12_4_;
        val_45.field_2.int_val = right_val.field_2._8_4_;
        val_45._4_4_ = right_val.field_2.vec2_val.y;
        val_45.type = right_val.field_2.int_val;
        val_45.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar26 = gs_val_to_float(val_45);
        fVar26 = 1.0 / fVar26;
        goto LAB_0013691e;
      }
      val_12.field_2._4_4_ = left_val.field_2._12_4_;
      val_12.field_2.int_val = left_val.field_2._8_4_;
      val_12._4_4_ = left_val.field_2.vec2_val.y;
      val_12.type = left_val.field_2.int_val;
      val_12.field_2._8_8_ = in_stack_ffffffffffffff10;
      iVar9 = gs_val_to_int(val_12);
      val_13.field_2._4_4_ = right_val.field_2._12_4_;
      val_13.field_2.int_val = right_val.field_2._8_4_;
      val_13._4_4_ = right_val.field_2.vec2_val.y;
      val_13.type = right_val.field_2.int_val;
      val_13.field_2._8_8_ = in_stack_ffffffffffffff10;
      iVar11 = gs_val_to_int(val_13);
      val.field_2.int_val = iVar9 / iVar11;
LAB_00135f2f:
      val.type = GS_VAL_INT;
      val.is_return = false;
      break;
    case 4:
      if (right_val.type == GS_VAL_INT && (left_val.type ^ GS_VAL_INT) == GS_VAL_VOID) {
        val_08.field_2._4_4_ = left_val.field_2._12_4_;
        val_08.field_2.int_val = left_val.field_2._8_4_;
        val_08._4_4_ = left_val.field_2.vec2_val.y;
        val_08.type = left_val.field_2.int_val;
        val_08.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar9 = gs_val_to_int(val_08);
        val_09.field_2._4_4_ = right_val.field_2._12_4_;
        val_09.field_2.int_val = right_val.field_2._8_4_;
        val_09._4_4_ = right_val.field_2.vec2_val.y;
        val_09.type = right_val.field_2.int_val;
        val_09.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar11 = gs_val_to_int(val_09);
        val_1.type = GS_VAL_BOOL;
        val_1.is_return = false;
        val_1.field_2.bool_val = iVar9 < iVar11;
      }
      else {
        if (((left_val.type ^ GS_VAL_INT) != GS_VAL_VOID || right_val.type != GS_VAL_FLOAT) &&
           ((right_val.type & ~GS_VAL_BOOL) != GS_VAL_INT || left_val.type != GS_VAL_FLOAT)) {
          pcVar21 = "Unable to less than these types";
          goto LAB_001367d2;
        }
        val_24.field_2._4_4_ = left_val.field_2._12_4_;
        val_24.field_2.int_val = left_val.field_2._8_4_;
        val_24._4_4_ = left_val.field_2.vec2_val.y;
        val_24.type = left_val.field_2.int_val;
        val_24.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar26 = gs_val_to_float(val_24);
        val_25.field_2._4_4_ = right_val.field_2._12_4_;
        val_25.field_2.int_val = right_val.field_2._8_4_;
        val_25._4_4_ = right_val.field_2.vec2_val.y;
        val_25.type = right_val.field_2.int_val;
        val_25.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar27 = gs_val_to_float(val_25);
        bVar25 = fVar27 == fVar26;
        bVar24 = fVar27 < fVar26;
LAB_001364af:
        val_1.type = GS_VAL_BOOL;
        val_1.is_return = false;
        val_1.field_2.bool_val = !bVar24 && !bVar25;
      }
      goto LAB_001367e1;
    case 5:
      if (right_val.type == GS_VAL_INT && (left_val.type ^ GS_VAL_INT) == GS_VAL_VOID) {
        val_18.field_2._4_4_ = left_val.field_2._12_4_;
        val_18.field_2.int_val = left_val.field_2._8_4_;
        val_18._4_4_ = left_val.field_2.vec2_val.y;
        val_18.type = left_val.field_2.int_val;
        val_18.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar9 = gs_val_to_int(val_18);
        val_19.field_2._4_4_ = right_val.field_2._12_4_;
        val_19.field_2.int_val = right_val.field_2._8_4_;
        val_19._4_4_ = right_val.field_2.vec2_val.y;
        val_19.type = right_val.field_2.int_val;
        val_19.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar11 = gs_val_to_int(val_19);
        val_1.type = GS_VAL_BOOL;
        val_1.is_return = false;
        val_1.field_2.bool_val = iVar11 < iVar9;
      }
      else {
        if (((left_val.type ^ GS_VAL_INT) == GS_VAL_VOID && right_val.type == GS_VAL_FLOAT) ||
           ((right_val.type & ~GS_VAL_BOOL) == GS_VAL_INT && left_val.type == GS_VAL_FLOAT)) {
          val_36.field_2._4_4_ = left_val.field_2._12_4_;
          val_36.field_2.int_val = left_val.field_2._8_4_;
          val_36._4_4_ = left_val.field_2.vec2_val.y;
          val_36.type = left_val.field_2.int_val;
          val_36.field_2._8_8_ = in_stack_ffffffffffffff10;
          fVar26 = gs_val_to_float(val_36);
          val_37.field_2._4_4_ = right_val.field_2._12_4_;
          val_37.field_2.int_val = right_val.field_2._8_4_;
          val_37._4_4_ = right_val.field_2.vec2_val.y;
          val_37.type = right_val.field_2.int_val;
          val_37.field_2._8_8_ = in_stack_ffffffffffffff10;
          fVar27 = gs_val_to_float(val_37);
          bVar25 = fVar26 == fVar27;
          bVar24 = fVar26 < fVar27;
          goto LAB_001364af;
        }
        pcVar21 = "Unable to greater than these types";
LAB_001367d2:
        gs_val_error(&val_1,pcVar21);
      }
      goto LAB_001367e1;
    case 6:
      if (right_val.type == GS_VAL_INT && (left_val.type ^ GS_VAL_INT) == GS_VAL_VOID) {
        val_20.field_2._4_4_ = left_val.field_2._12_4_;
        val_20.field_2.int_val = left_val.field_2._8_4_;
        val_20._4_4_ = left_val.field_2.vec2_val.y;
        val_20.type = left_val.field_2.int_val;
        val_20.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar9 = gs_val_to_int(val_20);
        val_21.field_2._4_4_ = right_val.field_2._12_4_;
        val_21.field_2.int_val = right_val.field_2._8_4_;
        val_21._4_4_ = right_val.field_2.vec2_val.y;
        val_21.type = right_val.field_2.int_val;
        val_21.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar11 = gs_val_to_int(val_21);
        val_1.type = GS_VAL_BOOL;
        val_1.is_return = false;
        val_1.field_2.bool_val = iVar9 <= iVar11;
      }
      else {
        if (((left_val.type ^ GS_VAL_INT) != GS_VAL_VOID || right_val.type != GS_VAL_FLOAT) &&
           ((right_val.type & ~GS_VAL_BOOL) != GS_VAL_INT || left_val.type != GS_VAL_FLOAT)) {
          pcVar21 = "Unable to less than equal add these types";
          goto LAB_001367d2;
        }
        val_38.field_2._4_4_ = left_val.field_2._12_4_;
        val_38.field_2.int_val = left_val.field_2._8_4_;
        val_38._4_4_ = left_val.field_2.vec2_val.y;
        val_38.type = left_val.field_2.int_val;
        val_38.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar26 = gs_val_to_float(val_38);
        val_39.field_2._4_4_ = right_val.field_2._12_4_;
        val_39.field_2.int_val = right_val.field_2._8_4_;
        val_39._4_4_ = right_val.field_2.vec2_val.y;
        val_39.type = right_val.field_2.int_val;
        val_39.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar27 = gs_val_to_float(val_39);
        bVar25 = fVar27 < fVar26;
LAB_0013652a:
        val_1.type = GS_VAL_BOOL;
        val_1.is_return = false;
        val_1.field_2.bool_val = !bVar25;
      }
      goto LAB_001367e1;
    case 7:
      if (right_val.type != GS_VAL_INT || (left_val.type ^ GS_VAL_INT) != GS_VAL_VOID) {
        if (((left_val.type ^ GS_VAL_INT) == GS_VAL_VOID && right_val.type == GS_VAL_FLOAT) ||
           ((right_val.type & ~GS_VAL_BOOL) == GS_VAL_INT && left_val.type == GS_VAL_FLOAT)) {
          val_30.field_2._4_4_ = left_val.field_2._12_4_;
          val_30.field_2.int_val = left_val.field_2._8_4_;
          val_30._4_4_ = left_val.field_2.vec2_val.y;
          val_30.type = left_val.field_2.int_val;
          val_30.field_2._8_8_ = in_stack_ffffffffffffff10;
          fVar26 = gs_val_to_float(val_30);
          val_31.field_2._4_4_ = right_val.field_2._12_4_;
          val_31.field_2.int_val = right_val.field_2._8_4_;
          val_31._4_4_ = right_val.field_2.vec2_val.y;
          val_31.type = right_val.field_2.int_val;
          val_31.field_2._8_8_ = in_stack_ffffffffffffff10;
          fVar27 = gs_val_to_float(val_31);
          bVar25 = fVar26 < fVar27;
          goto LAB_0013652a;
        }
        pcVar21 = "Unable to greater than equal these types";
        goto LAB_001367d2;
      }
      val_14.field_2._4_4_ = left_val.field_2._12_4_;
      val_14.field_2.int_val = left_val.field_2._8_4_;
      val_14._4_4_ = left_val.field_2.vec2_val.y;
      val_14.type = left_val.field_2.int_val;
      val_14.field_2._8_8_ = in_stack_ffffffffffffff10;
      iVar9 = gs_val_to_int(val_14);
      val_15.field_2._4_4_ = right_val.field_2._12_4_;
      val_15.field_2.int_val = right_val.field_2._8_4_;
      val_15._4_4_ = right_val.field_2.vec2_val.y;
      val_15.type = right_val.field_2.int_val;
      val_15.field_2._8_8_ = in_stack_ffffffffffffff10;
      iVar11 = gs_val_to_int(val_15);
      val_1.type = GS_VAL_BOOL;
      val_1.is_return = false;
      val_1.field_2.bool_val = iVar11 <= iVar9;
LAB_001367e1:
      val.field_2._8_8_ = CONCAT44(val_1.field_2._12_4_,val_1.field_2.vec3_val.z);
      val.type = val_1.type;
      val.is_return = val_1.is_return;
      val._5_2_ = val_1._5_2_;
      val._7_1_ = val_1._7_1_;
      val.field_2.int_val = val_1.field_2.int_val;
      val.field_2.field10[4] = val_1.field_2.field10[4];
LAB_00136811:
      val.field_2._5_2_ = val_1.field_2._5_2_;
      val.field_2.field10[7] = val_1.field_2.field10[7];
      break;
    case 8:
      if (right_val.type == GS_VAL_INT && (left_val.type ^ GS_VAL_INT) == GS_VAL_VOID) {
        val_22.field_2._4_4_ = left_val.field_2._12_4_;
        val_22.field_2.int_val = left_val.field_2._8_4_;
        val_22._4_4_ = left_val.field_2.vec2_val.y;
        val_22.type = left_val.field_2.int_val;
        val_22.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar9 = gs_val_to_int(val_22);
        val_23.field_2._4_4_ = right_val.field_2._12_4_;
        val_23.field_2.int_val = right_val.field_2._8_4_;
        val_23._4_4_ = right_val.field_2.vec2_val.y;
        val_23.type = right_val.field_2.int_val;
        val_23.field_2._8_8_ = in_stack_ffffffffffffff10;
        iVar11 = gs_val_to_int(val_23);
        bVar25 = iVar9 == iVar11;
LAB_00136141:
        val_1.type = GS_VAL_BOOL;
        val_1.is_return = false;
        val_1.field_2.bool_val = bVar25;
      }
      else if (((left_val.type ^ GS_VAL_INT) == GS_VAL_VOID && right_val.type == GS_VAL_FLOAT) ||
              ((right_val.type & ~GS_VAL_BOOL) == GS_VAL_INT && left_val.type == GS_VAL_FLOAT)) {
        val_40.field_2._4_4_ = left_val.field_2._12_4_;
        val_40.field_2.int_val = left_val.field_2._8_4_;
        val_40._4_4_ = left_val.field_2.vec2_val.y;
        val_40.type = left_val.field_2.int_val;
        val_40.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar26 = gs_val_to_float(val_40);
        val_41.field_2._4_4_ = right_val.field_2._12_4_;
        val_41.field_2.int_val = right_val.field_2._8_4_;
        val_41._4_4_ = right_val.field_2.vec2_val.y;
        val_41.type = right_val.field_2.int_val;
        val_41.field_2._8_8_ = in_stack_ffffffffffffff10;
        fVar27 = gs_val_to_float(val_41);
        val_1.type = GS_VAL_BOOL;
        val_1.is_return = false;
        val_1.field_2.bool_val = fVar26 == fVar27;
      }
      else {
        if (right_val.type == GS_VAL_BOOL && left_val.type == GS_VAL_BOOL) {
          bVar25 = left_val.field_2.bool_val == right_val.field_2.bool_val;
          goto LAB_00136141;
        }
        gs_val_error(&val_1,"Unable to equal these types");
      }
      val.field_2._8_8_ = CONCAT44(val_1.field_2._12_4_,val_1.field_2.vec3_val.z);
      val.type = val_1.type;
      val.is_return = val_1.is_return;
      val._5_2_ = val_1._5_2_;
      val._7_1_ = val_1._7_1_;
      val.field_2.int_val = val_1.field_2.int_val;
      val.field_2.field10[4] = val_1.field_2.field10[4];
      goto LAB_00136811;
    case 9:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                    ,0x416,"gs_val_t gs_eval_expr_binary_op(gs_eval_t *, gs_expr_t *)");
    }
switchD_0013576b_default:
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = val.field_2._8_8_;
    __return_storage_ptr__->type = val.type;
    __return_storage_ptr__->is_return = val.is_return;
    *(undefined2 *)&__return_storage_ptr__->field_0x5 = val._5_2_;
    __return_storage_ptr__->field_0x7 = val._7_1_;
    (__return_storage_ptr__->field_2).bool_val = val.field_2.bool_val;
    *(uint *)((long)&(__return_storage_ptr__->field_2).vec2_val.x + 1) =
         CONCAT13(val.field_2.field10[4],val.field_2.int_val._1_3_);
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 5) = val.field_2._5_2_;
    (__return_storage_ptr__->field_2).field10[7] = val.field_2.field10[7];
    break;
  case GS_EXPR_ASSIGNMENT:
    gs_eval_expr(&right_val_1,eval,(expr->field_2).binary_op.left);
    uVar22 = right_val_1.is_return;
    if (right_val_1.is_return == true) {
      right_val._3_4_ = right_val_1.field_2.int_val;
      right_val.type._0_3_ = right_val_1._5_3_;
      right_val._7_1_ = right_val_1.field_2.field10[4];
      right_val.field_2.int_val =
           (int)CONCAT43(right_val_1.field_2.vec3_val.z,right_val_1.field_2._5_3_);
      right_val.field_2.field10[7] = (undefined1)right_val_1.field_2._12_4_;
      right_val.field_2._4_3_ = (int3)((uint)right_val_1.field_2._8_4_ >> 8);
      right_val.field_2._8_4_ = right_val_1.field_2._12_4_ >> 8;
      val_1.is_return = right_val_1.is_return;
      val_1.type = right_val_1.type;
    }
    else {
      paVar19 = &expr->field_2;
      while( true ) {
        pgVar5 = (paVar19->assignment).left;
        gVar4 = pgVar5->type;
        if (gVar4 != GS_EXPR_MEMBER_ACCESS) break;
        paVar19 = &pgVar5->field_2;
      }
      if (gVar4 == GS_EXPR_ARRAY_ACCESS) {
        pcVar21 = (char *)eval;
        gs_eval_expr(&left_val,eval,(pgVar5->field_2).assignment.left);
        uVar28 = right_val.field_2.vec3_val.z;
        if (left_val.is_return != true) {
          if (left_val.type != GS_VAL_LIST) {
            pcVar21 = "Expecing type list";
LAB_00135b6b:
            gs_val_error(&val_1,pcVar21);
            goto LAB_00135b7a;
          }
          gs_eval_expr(&right_val,eval,(pgVar5->field_2).binary_op.left);
          pcVar21 = (char *)eval;
          uVar28 = right_val.field_2.vec3_val.z;
          if (right_val.is_return != true) {
            val_03.field_2._12_4_ = right_val.field_2._12_4_;
            val_03.field_2.vec3_val.z = right_val.field_2.vec3_val.z;
            val_03.field_2.int_val = right_val.field_2.int_val;
            val_03.type = right_val.type;
            val_03.is_return = right_val.is_return;
            val_03._5_3_ = right_val._5_3_;
            val_03.field_2.vec2_val.y = right_val.field_2.vec2_val.y;
            gs_eval_cast(&val_1,eval,val_03,GS_VAL_INT);
            right_val.field_2.vec3_val.z = val_1.field_2.vec3_val.z;
            uVar28 = right_val.field_2.vec3_val.z;
            right_val.field_2.field10[0xb] = (undefined1)((uint)val_1.field_2._8_4_ >> 0x18);
            right_val.field_2.vec2_val.y =
                 (float)(CONCAT17(val_1.field_2.field10[7],
                                  CONCAT25(val_1.field_2._5_2_,
                                           CONCAT14(val_1.field_2.field10[4],val_1.field_2.int_val))
                                 ) >> 0x20);
            pcVar21 = (char *)eval;
            if (val_1.is_return != true) {
              right_val.field_2.vec3_val.z = (float)uVar28;
              if ((long)val_1.field_2.int_val < 0) {
                pcVar21 = "Invalid list index";
              }
              else {
                if ((uint)val_1.field_2.int_val < 0x3e81) {
                  data = (char **)CONCAT44(left_val.field_2.vec2_val.y,left_val.field_2.int_val);
                  iVar9 = *(int *)(data + 1);
                  if (iVar9 <= val_1.field_2.int_val) {
                    for (; iVar9 <= val_1.field_2.int_val; iVar9 = iVar9 + 1) {
                      eval = (gs_eval_t *)(data + 1);
                      iVar11 = vec_expand_(data,(int *)(data + 1),(int *)((long)data + 0xc),0x18,
                                           data[2]);
                      if (iVar11 == 0) {
                        pcVar6 = *data;
                        iVar11 = *(int *)(data + 1);
                        *(int *)(data + 1) = iVar11 + 1;
                        lVar17 = (long)iVar11 * 0x18;
                        pcVar21 = pcVar6 + lVar17;
                        pcVar21[0] = '\x02';
                        pcVar21[1] = '\0';
                        pcVar21[2] = '\0';
                        pcVar21[3] = '\0';
                        pcVar6[lVar17 + 4] = '\0';
                        pcVar6 = pcVar6 + lVar17 + 8;
                        pcVar6[0] = '\0';
                        pcVar6[1] = '\0';
                        pcVar6[2] = '\0';
                        pcVar6[3] = '\0';
                      }
                    }
                  }
                  pcVar21 = *data;
                  lVar17 = (long)val_1.field_2.int_val * 0x18;
                  ppmVar12 = (map_node_t **)(pcVar21 + lVar17);
                  val_1.field_2.vec3_val.z = (float)*(undefined8 *)(pcVar21 + lVar17 + 0x10);
                  val_1.field_2._12_4_ =
                       (undefined4)((ulong)*(undefined8 *)(pcVar21 + lVar17 + 0x10) >> 0x20);
                  pgVar2 = (gs_val_type *)(pcVar21 + lVar17);
                  val_1.type = *pgVar2;
                  gVar10 = pgVar2[1];
                  val_1.field_2.int_val = pgVar2[2];
                  gVar29 = pgVar2[3];
                  goto LAB_001356e0;
                }
                pcVar21 = "List index larger than max of 16000";
              }
              goto LAB_00135b6b;
            }
          }
        }
        right_val.field_2.vec3_val.z = (float)uVar28;
        val_1.field_2.vec3_val.z = left_val.field_2.vec3_val.z;
        val_1.field_2._12_4_ = left_val.field_2._12_4_;
        val_1.type = left_val.type;
        val_1.is_return = left_val.is_return;
        val_1._5_2_ = left_val._5_2_;
        val_1._7_1_ = left_val._7_1_;
        val_1.field_2.int_val = left_val.field_2.int_val;
        val_1.field_2.field10[4] = SUB41(left_val.field_2.vec2_val.y,0);
        val_1.field_2._5_2_ = (undefined2)((uint)left_val.field_2._4_4_ >> 8);
        val_1.field_2.field10[7] = (undefined1)((uint)left_val.field_2._4_4_ >> 0x18);
      }
      else {
        if (gVar4 != GS_EXPR_SYMBOL) {
          pcVar21 = "Expected lval";
          goto LAB_00135b6b;
        }
        uVar23 = (ulong)(uint)(eval->env).length;
        do {
          if ((int)uVar23 < 1) {
            pcVar21 = "Unable to find symbol %s";
            gs_val_error(&val_1,"Unable to find symbol %s",(pgVar5->field_2).symbol);
            goto LAB_00135b7a;
          }
          pmVar14 = (map_base_t *)(eval->env).data[uVar23 - 1];
          uVar23 = uVar23 - 1;
          pgVar20 = (gs_eval_t *)(pgVar5->field_2).assignment.left;
          ppmVar12 = (map_node_t **)map_get_(pmVar14,(char *)pgVar20);
          pmVar14[1].buckets = ppmVar12;
        } while (ppmVar12 == (map_node_t **)0x0);
        val_1.field_2.vec3_val.z = SUB84(ppmVar12[2],0);
        val_1.field_2._12_4_ = (undefined4)((ulong)ppmVar12[2] >> 0x20);
        val_1.type = *(gs_val_type *)ppmVar12;
        gVar10 = *(gs_val_type *)((long)ppmVar12 + 4);
        val_1.field_2.int_val = *(undefined4 *)(ppmVar12 + 1);
        gVar29 = *(gs_val_type *)((long)ppmVar12 + 0xc);
        eval = pgVar20;
LAB_001356e0:
        val_1.is_return = SUB41(gVar10,0);
        val_1._5_2_ = SUB42(gVar10 >> 8,0);
        val_1._7_1_ = SUB41(gVar10 >> 0x18,0);
        val_1.field_2.field10[4] = (undefined1)gVar29;
        val_1.field_2._5_2_ = (undefined2)(gVar29 >> 8);
        val_1.field_2.field10[7] = (undefined1)(gVar29 >> 0x18);
        pcVar21 = (char *)eval;
        unaff_R12 = ppmVar12;
      }
LAB_00135b7a:
      right_val.type._2_1_ = val_1._7_1_;
      right_val.type._0_2_ = val_1._5_2_;
      right_val._3_4_ = val_1.field_2.int_val;
      right_val._7_1_ = val_1.field_2.field10[4];
      right_val.field_2.int_val =
           (int)CONCAT43(val_1.field_2.vec3_val.z,
                         CONCAT12(val_1.field_2.field10[7],val_1.field_2._5_2_));
      right_val.field_2.field10[7] = (undefined1)val_1.field_2._12_4_;
      right_val.field_2._4_3_ = (int3)((uint)val_1.field_2._8_4_ >> 8);
      right_val.field_2._8_3_ = (undefined3)((uint)val_1.field_2._12_4_ >> 8);
      if ((val_1.is_return & 1U) == 0) {
        if (unaff_R12 == (map_node_t **)0x0) {
          __assert_fail("lval",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                        ,0x42a,"gs_val_t gs_eval_expr_assignment(gs_eval_t *, gs_expr_t *)");
        }
        pgVar5 = (expr->field_2).assignment.left;
        gVar4 = pgVar5->type;
        if (gVar4 == GS_EXPR_ARRAY_ACCESS) {
LAB_00135c8d:
          unaff_R12[2] = (map_node_t *)
                         CONCAT44(right_val_1.field_2._12_4_,right_val_1.field_2.vec3_val.z);
          *unaff_R12 = (map_node_t *)CONCAT44(right_val_1._4_4_,right_val_1.type);
          unaff_R12[1] = (map_node_t *)
                         CONCAT44(right_val_1.field_2.vec2_val.y,right_val_1.field_2.int_val);
LAB_00135caa:
          right_val._3_4_ = right_val_1.field_2.int_val;
          right_val.type._0_3_ = right_val_1._5_3_;
          right_val._7_1_ = right_val_1.field_2.field10[4];
          right_val.field_2.int_val =
               (int)CONCAT43(right_val_1.field_2.vec3_val.z,right_val_1.field_2._5_3_);
          val_1.is_return = (_Bool)uVar22;
          val_1.type = right_val_1.type;
        }
        else {
          if (gVar4 != GS_EXPR_MEMBER_ACCESS) {
            val_05.field_2._12_4_ = right_val_1.field_2._12_4_;
            val_05.field_2.vec3_val.z = right_val_1.field_2.vec3_val.z;
            val_05.is_return = right_val_1.is_return;
            val_05._5_3_ = right_val_1._5_3_;
            val_05.type = right_val_1.type;
            val_05.field_2.int_val = right_val_1.field_2.int_val;
            val_05.field_2.vec2_val.y = right_val_1.field_2.vec2_val.y;
            gs_eval_cast(&left_val,(gs_eval_t *)pcVar21,val_05,*(gs_val_type *)unaff_R12);
            right_val_1.field_2.vec3_val.z = left_val.field_2.vec3_val.z;
            right_val_1.field_2._12_4_ = left_val.field_2._12_4_;
            right_val_1.type = left_val.type;
            right_val_1._4_4_ =
                 SUB84(CONCAT17(left_val._7_1_,
                                CONCAT25(left_val._5_2_,CONCAT14(left_val.is_return,left_val.type)))
                       >> 0x20,0);
            right_val_1.field_2.int_val = left_val.field_2.int_val;
            right_val_1.field_2.vec2_val.y = left_val.field_2.vec2_val.y;
            uVar22 = left_val.is_return;
            if (left_val.is_return != true) goto LAB_00135c8d;
            goto LAB_00135caa;
          }
          pcVar6 = *(char **)((long)&pgVar5->field_2 + 0x18);
          val_04.field_2._12_4_ = right_val_1.field_2._12_4_;
          val_04.field_2.vec3_val.z = right_val_1.field_2.vec3_val.z;
          val_04.is_return = right_val_1.is_return;
          val_04._5_3_ = right_val_1._5_3_;
          val_04.type = right_val_1.type;
          val_04.field_2.int_val = right_val_1.field_2.int_val;
          val_04.field_2.vec2_val.y = right_val_1.field_2.vec2_val.y;
          gs_eval_cast(&left_val,(gs_eval_t *)pcVar21,val_04,GS_VAL_FLOAT);
          right_val_1.field_2.vec3_val.z = left_val.field_2.vec3_val.z;
          right_val_1.field_2._12_4_ = left_val.field_2._12_4_;
          right_val_1._5_2_ = left_val._5_2_;
          right_val_1.is_return = left_val.is_return;
          right_val_1._7_1_ = left_val._7_1_;
          right_val_1.type = left_val.type;
          right_val_1.field_2.int_val = left_val.field_2.int_val;
          right_val_1.field_2.vec2_val.y = left_val.field_2.vec2_val.y;
          uVar22 = left_val.is_return;
          if (left_val.is_return == true) goto LAB_00135caa;
          if (*(gs_val_type *)unaff_R12 == GS_VAL_VEC3) {
            cVar3 = *pcVar6;
            if (cVar3 != 'z') goto LAB_0013616e;
            if (pcVar6[1] == '\0') {
              *(int *)(unaff_R12 + 2) = left_val.field_2.int_val;
            }
            goto LAB_00135caa;
          }
          if (*(gs_val_type *)unaff_R12 == GS_VAL_VEC2) {
            cVar3 = *pcVar6;
LAB_0013616e:
            if (cVar3 == 'y') {
              if (pcVar6[1] == '\0') {
                *(int *)((long)unaff_R12 + 0xc) = left_val.field_2.int_val;
              }
            }
            else if ((cVar3 == 'x') && (pcVar6[1] == '\0')) {
              *(int *)(unaff_R12 + 1) = left_val.field_2.int_val;
            }
            goto LAB_00135caa;
          }
          gs_val_error(&left_val,"Unable to perform member access on type");
          right_val.type._2_1_ = left_val._7_1_;
          right_val.type._0_2_ = left_val._5_2_;
          right_val._3_4_ = left_val.field_2.int_val;
          right_val._7_1_ = left_val.field_2.field10[4];
          right_val.field_2.int_val =
               (int)CONCAT43(left_val.field_2.vec3_val.z,left_val.field_2._5_3_);
          val_1.is_return = left_val.is_return;
          val_1.type = left_val.type;
          right_val_1.field_2._12_4_ = left_val.field_2._12_4_;
          right_val_1.field_2.vec3_val.z = left_val.field_2.vec3_val.z;
        }
        right_val.field_2.field10[7] = (undefined1)right_val_1.field_2._12_4_;
        right_val.field_2.vec2_val.y =
             (float)CONCAT13(right_val.field_2.field10[7],
                             (int3)((uint)right_val_1.field_2.vec3_val.z >> 8));
        right_val.field_2._8_4_ = right_val_1.field_2._12_4_ >> 8;
      }
    }
    __return_storage_ptr__->type = val_1.type;
    __return_storage_ptr__->is_return = val_1.is_return;
    *(undefined8 *)&__return_storage_ptr__->field_0x5 = right_val._0_8_;
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 5) =
         CONCAT44(right_val.field_2.vec2_val.y,right_val.field_2.int_val);
    *(uint *)((long)&__return_storage_ptr__->field_2 + 0xc) =
         CONCAT31(right_val.field_2._8_3_,right_val.field_2.field10[7]);
    break;
  case GS_EXPR_INT:
    iVar9 = (expr->field_2).int_val;
    __return_storage_ptr__->type = GS_VAL_INT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).int_val = iVar9;
    break;
  case GS_EXPR_FLOAT:
    iVar9 = (expr->field_2).int_val;
    __return_storage_ptr__->type = GS_VAL_FLOAT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).int_val = iVar9;
    break;
  case GS_EXPR_SYMBOL:
    uVar23 = (ulong)(uint)(eval->env).length;
    do {
      if ((int)uVar23 < 1) {
        gs_val_error(&left_val,"Could not find symbol %s",(expr->field_2).symbol);
        goto LAB_0013558d;
      }
      pmVar14 = (map_base_t *)(eval->env).data[uVar23 - 1];
      uVar23 = uVar23 - 1;
      ppmVar12 = (map_node_t **)map_get_(pmVar14,(expr->field_2).symbol);
      pmVar14[1].buckets = ppmVar12;
    } while (ppmVar12 == (map_node_t **)0x0);
    left_val.field_2.vec3_val.z = SUB84(ppmVar12[2],0);
    left_val.field_2._12_4_ = (undefined4)((ulong)ppmVar12[2] >> 0x20);
    pmVar7 = *ppmVar12;
    left_val.type = (gs_val_type)pmVar7;
    left_val.is_return = SUB81((ulong)pmVar7 >> 0x20,0);
    left_val._5_2_ = SUB82((ulong)pmVar7 >> 0x28,0);
    left_val._7_1_ = SUB81((ulong)pmVar7 >> 0x38,0);
    left_val.field_2.int_val = (int)ppmVar12[1];
    left_val.field_2.vec2_val.y = (float)((ulong)ppmVar12[1] >> 0x20);
LAB_0013558d:
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT44(left_val.field_2._12_4_,left_val.field_2.vec3_val.z);
    right_val._5_2_ = left_val._5_2_;
    right_val.is_return = left_val.is_return;
    right_val._7_1_ = left_val._7_1_;
    right_val.type = left_val.type;
    right_val.field_2.int_val = left_val.field_2.int_val;
    right_val.field_2.vec2_val.y = left_val.field_2.vec2_val.y;
    goto LAB_00135e04;
  case GS_EXPR_STRING:
    str = (golf_string_t *)golf_alloc_tracked(0x18,"script/eval");
    iVar9 = vec_expand_((char **)eval,&(eval->allocated_strings).length,
                        &(eval->allocated_strings).capacity,8,
                        (eval->allocated_strings).alloc_category);
    if (iVar9 == 0) {
      iVar9 = (eval->allocated_strings).length;
      (eval->allocated_strings).length = iVar9 + 1;
      (eval->allocated_strings).data[iVar9] = str;
    }
    golf_string_init(str,"script/eval",(expr->field_2).symbol);
    __return_storage_ptr__->type = GS_VAL_STRING;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).string_val = str;
    break;
  case GS_EXPR_CALL:
    pmVar14 = (map_base_t *)
              golf_alloc_tracked(0x38,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                                );
    pmVar14->buckets = (map_node_t **)0x0;
    pmVar14->nbuckets = 0;
    pmVar14->nnodes = 0;
    pmVar14[1].buckets = (map_node_t **)0x0;
    pmVar14[1].nbuckets = 0;
    pmVar14[1].nnodes = 0;
    pmVar14[2].buckets = (map_node_t **)0x0;
    pmVar14[2].nbuckets = 0;
    pmVar14[2].nnodes = 0;
    pmVar14[3].buckets = (map_node_t **)"script/eval";
    left_val.type = GS_VAL_VOID;
    left_val.is_return = false;
    left_val._5_2_ = 0;
    left_val._7_1_ = 0;
    left_val.field_2.int_val = 0;
    left_val.field_2.vec2_val.y = 0.0;
    left_val.field_2.vec3_val.z = 2.787771e-39;
    left_val.field_2._12_4_ = 0;
    gs_eval_expr(&right_val_1,eval,(expr->field_2).assignment.left);
    if (right_val_1.is_return == false) {
      if (right_val_1.type == GS_VAL_FN) {
        lVar17 = CONCAT44(right_val_1.field_2.vec2_val.y,right_val_1.field_2.int_val);
        iVar9 = (expr->field_2).call.num_args;
        if (iVar9 != *(int *)(lVar17 + 0x28)) {
          pcVar21 = "Wrong number of args passed to function call";
          goto LAB_00135ac5;
        }
        lVar15 = 2;
        for (lVar16 = 0; lVar16 < iVar9; lVar16 = lVar16 + 1) {
          pcVar21 = *(char **)(*(long *)(lVar17 + 0x38) + lVar15 * 8);
          gVar10 = *(gs_val_type *)(*(long *)(lVar17 + 0x30) + lVar16 * 4);
          pgVar20 = eval;
          gs_eval_expr(&right_val,eval,
                       *(gs_expr_t **)(&((expr->field_2).binary_op.right)->type + lVar16 * 2));
          if (right_val.is_return != false) {
LAB_00135b04:
            right_val_1.field_2.vec3_val.z = right_val.field_2.vec3_val.z;
            right_val_1.field_2._12_4_ = right_val.field_2._12_4_;
            right_val_1.type = right_val.type;
            right_val_1._4_4_ = right_val._4_4_;
            right_val_1.field_2.int_val = right_val.field_2.int_val;
            right_val_1.field_2.vec2_val.y = right_val.field_2.vec2_val.y;
            goto LAB_00135dd6;
          }
          val_02.field_2._12_4_ = right_val.field_2._12_4_;
          val_02.field_2.vec3_val.z = right_val.field_2.vec3_val.z;
          val_02.field_2.int_val = right_val.field_2.int_val;
          val_02.type = right_val.type;
          val_02.is_return = right_val.is_return;
          val_02._5_3_ = right_val._5_3_;
          val_02.field_2.vec2_val.y = right_val.field_2.vec2_val.y;
          gs_eval_cast(&val_1,pgVar20,val_02,gVar10);
          right_val.field_2.vec3_val.z = val_1.field_2.vec3_val.z;
          right_val.field_2._12_4_ = val_1.field_2._12_4_;
          right_val.is_return = val_1.is_return;
          right_val.type = val_1.type;
          right_val._5_2_ = val_1._5_2_;
          right_val._7_1_ = val_1._7_1_;
          right_val.field_2.int_val = val_1.field_2.int_val;
          right_val.field_2.vec2_val.y =
               (float)(CONCAT17(val_1.field_2.field10[7],
                                CONCAT25(val_1.field_2._5_2_,
                                         CONCAT14(val_1.field_2.field10[4],val_1.field_2.int_val)))
                      >> 0x20);
          if (val_1.is_return != false) goto LAB_00135b04;
          pmVar14[2].nbuckets = val_1.field_2._8_4_;
          pmVar14[2].nnodes = val_1.field_2._12_4_;
          *(undefined8 *)&pmVar14[1].nbuckets = right_val._0_8_;
          pmVar14[2].buckets =
               (map_node_t **)CONCAT44(right_val.field_2.vec2_val.y,val_1.field_2.int_val);
          map_set_(pmVar14,pcVar21,&pmVar14[1].nbuckets,0x18,(char *)pmVar14[3].buckets);
          iVar9 = *(int *)(lVar17 + 0x28);
          lVar15 = lVar15 + 3;
        }
        piVar18 = &(eval->env).length;
        iVar9 = vec_expand_((char **)&eval->env,piVar18,&(eval->env).capacity,8,
                            (eval->env).alloc_category);
        if (iVar9 == 0) {
          iVar9 = *piVar18;
          *piVar18 = iVar9 + 1;
          (eval->env).data[iVar9] = (gs_env_t *)pmVar14;
        }
        gs_eval_stmt(&right_val_1,eval,*(gs_stmt_t **)(lVar17 + 0x40));
        if (right_val_1.type != GS_VAL_ERROR) {
          right_val_1._4_4_ = right_val_1._4_4_ & 0xffffff00;
        }
        *piVar18 = *piVar18 + -1;
      }
      else if (right_val_1.type == GS_VAL_C_FN) {
        for (lVar17 = 0; lVar17 < (expr->field_2).call.num_args; lVar17 = lVar17 + 1) {
          gs_eval_expr(&right_val,eval,
                       *(gs_expr_t **)(&((expr->field_2).binary_op.right)->type + lVar17 * 2));
          if (right_val.is_return != false) {
            right_val_1.field_2.vec3_val.z = right_val.field_2.vec3_val.z;
            right_val_1.field_2._12_4_ = right_val.field_2._12_4_;
            right_val_1.type = right_val.type;
            right_val_1._4_4_ = right_val._4_4_;
            right_val_1.field_2.int_val = right_val.field_2.int_val;
            right_val_1.field_2.vec2_val.y = right_val.field_2.vec2_val.y;
            goto LAB_00135dd6;
          }
          iVar9 = vec_expand_((char **)&left_val,&left_val.field_2.int_val,
                              (int *)&left_val.field_2.vec2_val.y,0x18,
                              (char *)CONCAT44(left_val.field_2._12_4_,left_val.field_2.vec3_val.z))
          ;
          if (iVar9 == 0) {
            lVar15 = CONCAT17(left_val._7_1_,
                              CONCAT25(left_val._5_2_,CONCAT14(left_val.is_return,left_val.type)));
            lVar16 = (long)left_val.field_2.int_val;
            left_val.field_2.int_val = left_val.field_2.int_val + 1;
            *(ulong *)(lVar15 + 0x10 + lVar16 * 0x18) =
                 CONCAT44(right_val.field_2._12_4_,right_val.field_2.vec3_val.z);
            puVar1 = (undefined8 *)(lVar15 + lVar16 * 0x18);
            *puVar1 = right_val._0_8_;
            puVar1[1] = CONCAT44(right_val.field_2.vec2_val.y,right_val.field_2.int_val);
          }
        }
        (*(code *)CONCAT44(right_val_1.field_2.vec2_val.y,right_val_1.field_2.int_val))
                  (&right_val_1,eval,
                   CONCAT17(left_val._7_1_,
                            CONCAT25(left_val._5_2_,CONCAT14(left_val.is_return,left_val.type))),
                   left_val.field_2.int_val);
        if (right_val_1.type != GS_VAL_ERROR) {
          right_val_1._4_4_ = right_val_1._4_4_ & 0xffffff00;
        }
      }
      else {
        pcVar21 = "Expected a function when evaling call expr";
LAB_00135ac5:
        gs_val_error(&right_val_1,pcVar21);
      }
    }
LAB_00135dd6:
    map_deinit_(pmVar14);
    golf_free_tracked(pmVar14);
    golf_free_tracked((void *)CONCAT17(left_val._7_1_,
                                       CONCAT25(left_val._5_2_,
                                                CONCAT14(left_val.is_return,left_val.type))));
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT44(right_val_1.field_2._12_4_,right_val_1.field_2.vec3_val.z);
    right_val.type = right_val_1.type;
    right_val._4_4_ = right_val_1._4_4_;
    right_val.field_2.int_val = right_val_1.field_2.int_val;
    right_val.field_2.vec2_val.y = right_val_1.field_2.vec2_val.y;
    goto LAB_00135e04;
  case GS_EXPR_MEMBER_ACCESS:
    gs_eval_expr(&left_val,eval,(expr->field_2).assignment.left);
    if (left_val.is_return == false) {
      pcVar21 = *(char **)((long)&expr->field_2 + 0x18);
      if (left_val.type == GS_VAL_LIST) {
        iVar9 = strcmp(pcVar21,"length");
        if (iVar9 == 0) {
          left_val.field_2.int_val =
               *(int *)(CONCAT44(left_val.field_2.vec2_val.y,left_val.field_2.int_val) + 8);
          left_val.type = GS_VAL_INT;
          left_val.is_return = false;
          goto LAB_00135d21;
        }
        pcVar21 = "Invalid member for list";
      }
      else {
        uVar28 = left_val.field_2.vec2_val.y;
        if (left_val.type != GS_VAL_VEC3) {
          if (left_val.type != GS_VAL_VEC2) {
            pcVar21 = "Invalid type for member access";
            goto LAB_00135d15;
          }
          if (*pcVar21 != 'y') {
            if ((*pcVar21 == 'x') && (pcVar21[1] == '\0')) {
LAB_0013594c:
              left_val.type = GS_VAL_FLOAT;
              left_val.is_return = false;
              goto LAB_00135d21;
            }
LAB_00135cea:
            pcVar21 = "Invalid member for vec2";
            goto LAB_00135d15;
          }
          if (pcVar21[1] != '\0') goto LAB_00135cea;
LAB_0013662b:
          left_val.type = GS_VAL_FLOAT;
          left_val.is_return = false;
          left_val.field_2.int_val = uVar28;
          goto LAB_00135d21;
        }
        cVar3 = *pcVar21;
        if (cVar3 == 'z') {
          cVar3 = pcVar21[1];
          uVar28 = left_val.field_2.vec3_val.z;
joined_r0x00135d08:
          if (cVar3 == '\0') goto LAB_0013662b;
        }
        else {
          if (cVar3 == 'y') {
            cVar3 = pcVar21[1];
            goto joined_r0x00135d08;
          }
          if ((cVar3 == 'x') && (pcVar21[1] == '\0')) goto LAB_0013594c;
        }
        pcVar21 = "Invalid member for vec3";
      }
LAB_00135d15:
      gs_val_error(&left_val,pcVar21);
    }
LAB_00135d21:
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT44(left_val.field_2._12_4_,left_val.field_2.vec3_val.z);
    __return_storage_ptr__->type = left_val.type;
    __return_storage_ptr__->is_return = left_val.is_return;
    *(undefined2 *)&__return_storage_ptr__->field_0x5 = left_val._5_2_;
    __return_storage_ptr__->field_0x7 = left_val._7_1_;
    (__return_storage_ptr__->field_2).int_val = left_val.field_2.int_val;
    (__return_storage_ptr__->field_2).vec2_val.y = left_val.field_2.vec2_val.y;
    break;
  case GS_EXPR_ARRAY_ACCESS:
    gs_eval_expr(&left_val,eval,(expr->field_2).assignment.left);
    if (left_val.is_return == true) {
LAB_00135543:
      val_1.field_2.vec3_val.z = left_val.field_2.vec3_val.z;
      val_1.field_2._12_4_ = left_val.field_2._12_4_;
      gVar10 = CONCAT13(left_val._7_1_,CONCAT21(left_val._5_2_,left_val.is_return));
LAB_00135555:
      val_1.is_return = SUB41(gVar10,0);
      val_1._5_2_ = SUB42(gVar10 >> 8,0);
      val_1._7_1_ = SUB41(gVar10 >> 0x18,0);
      val_1.field_2.field10[4] = SUB41(left_val.field_2.vec2_val.y,0);
      val_1.field_2._5_2_ = (undefined2)((uint)left_val.field_2.vec2_val.y >> 8);
      val_1.field_2.field10[7] = (undefined1)((uint)left_val.field_2.vec2_val.y >> 0x18);
      val_1.type = left_val.type;
      val_1.field_2.int_val = left_val.field_2.int_val;
    }
    else {
      gs_eval_expr(&right_val,eval,(expr->field_2).binary_op.left);
      if (right_val.is_return == true) goto LAB_00135543;
      val_01.field_2._12_4_ = right_val.field_2._12_4_;
      val_01.field_2.vec3_val.z = right_val.field_2.vec3_val.z;
      val_01.field_2.int_val = right_val.field_2.int_val;
      val_01.type = right_val.type;
      val_01.is_return = right_val.is_return;
      val_01._5_3_ = right_val._5_3_;
      val_01.field_2.vec2_val.y = right_val.field_2.vec2_val.y;
      gs_eval_cast(&val_1,eval,val_01,GS_VAL_INT);
      right_val.field_2.int_val = val_1.field_2.int_val;
      if (val_1.is_return == true) goto LAB_00135543;
      if (left_val.type == GS_VAL_LIST) {
        if (((long)val_1.field_2.int_val < 0) ||
           ((int)((long *)CONCAT44(left_val.field_2.vec2_val.y,left_val.field_2.int_val))[1] <=
            val_1.field_2.int_val)) {
          pcVar21 = "Invalid list index";
          goto LAB_00135b50;
        }
        lVar17 = *(long *)CONCAT44(left_val.field_2.vec2_val.y,left_val.field_2.int_val);
        lVar15 = (long)val_1.field_2.int_val * 0x18;
        uVar31 = *(undefined8 *)(lVar17 + 0x10 + lVar15);
        val_1.field_2.vec3_val.z = (float)uVar31;
        val_1.field_2._12_4_ = (undefined4)((ulong)uVar31 >> 0x20);
        pgVar2 = (gs_val_type *)(lVar17 + lVar15);
        left_val.type = *pgVar2;
        gVar10 = pgVar2[1];
        left_val.field_2.int_val = pgVar2[2];
        left_val.field_2.vec2_val.y = (float)pgVar2[3];
        goto LAB_00135555;
      }
      pcVar21 = "Expected type list";
LAB_00135b50:
      gs_val_error(&val_1,pcVar21);
    }
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT44(val_1.field_2._12_4_,val_1.field_2.vec3_val.z);
    right_val._5_2_ = val_1._5_2_;
    right_val.is_return = val_1.is_return;
    right_val._7_1_ = val_1._7_1_;
    right_val.field_2.vec2_val.y =
         (float)CONCAT13(val_1.field_2.field10[7],
                         CONCAT21(val_1.field_2._5_2_,val_1.field_2.field10[4]));
    right_val.type = val_1.type;
    right_val.field_2.int_val = val_1.field_2.int_val;
    goto LAB_00135e04;
  case GS_EXPR_ARRAY_DECL:
    vVar13 = (vec2)golf_alloc_tracked(0x18,"script/eval");
    *(char **)vVar13 = (char *)0x0;
    *(char **)((long)vVar13 + 8) = (char *)0x0;
    *(char **)((long)vVar13 + 0x10) = "script/eval";
    for (lVar17 = 0; lVar17 < (expr->field_2).int_val; lVar17 = lVar17 + 1) {
      gs_eval_expr(&left_val,eval,
                   *(gs_expr_t **)(&((expr->field_2).binary_op.left)->type + lVar17 * 2));
      if (left_val.is_return != false) {
        right_val.type._2_1_ = left_val._7_1_;
        right_val.type._0_2_ = left_val._5_2_;
        vVar8.y = left_val.field_2.vec2_val.y;
        vVar8.x = left_val.field_2.float_val;
        piVar18 = (int *)CONCAT44(left_val.field_2._12_4_,left_val.field_2.vec3_val.z);
        golf_free_tracked(*(char **)vVar13);
        golf_free_tracked((void *)vVar13);
        vVar13 = vVar8;
        goto LAB_00135721;
      }
      iVar9 = vec_expand_((char **)vVar13,(int *)((long)vVar13 + 8),(int *)((long)vVar13 + 0xc),0x18
                          ,*(char **)((long)vVar13 + 0x10));
      if (iVar9 == 0) {
        pcVar21 = *(char **)vVar13;
        iVar9 = *(int *)((long)vVar13 + 8);
        *(int *)((long)vVar13 + 8) = iVar9 + 1;
        lVar15 = (long)iVar9 * 0x18;
        *(ulong *)(pcVar21 + lVar15 + 0x10) =
             CONCAT44(left_val.field_2._12_4_,left_val.field_2.vec3_val.z);
        pcVar21 = pcVar21 + lVar15;
        *(ulong *)pcVar21 =
             CONCAT17(left_val._7_1_,
                      CONCAT25(left_val._5_2_,CONCAT14(left_val.is_return,left_val.type)));
        *(ulong *)(pcVar21 + 8) = CONCAT44(left_val.field_2.vec2_val.y,left_val.field_2.int_val);
      }
    }
    piVar18 = &(eval->allocated_lists).length;
    iVar9 = vec_expand_((char **)&eval->allocated_lists,piVar18,&(eval->allocated_lists).capacity,8,
                        (eval->allocated_lists).alloc_category);
    left_val.type = GS_VAL_LIST;
    if (iVar9 == 0) {
      iVar9 = *piVar18;
      *piVar18 = iVar9 + 1;
      *(vec2 *)((eval->allocated_lists).data + iVar9) = vVar13;
    }
    left_val.is_return = false;
LAB_00135721:
    __return_storage_ptr__->type = left_val.type;
    __return_storage_ptr__->is_return = left_val.is_return;
    *(undefined2 *)&__return_storage_ptr__->field_0x5 = (undefined2)right_val.type;
    __return_storage_ptr__->field_0x7 = right_val.type._2_1_;
    (__return_storage_ptr__->field_2).vec2_val = vVar13;
    *(int **)((long)&__return_storage_ptr__->field_2 + 8) = piVar18;
    break;
  case GS_EXPR_CAST:
    gs_eval_expr(&right_val,eval,(expr->field_2).binary_op.left);
    if (right_val.is_return == false) {
      val_00.field_2._12_4_ = right_val.field_2._12_4_;
      val_00.field_2.vec3_val.z = right_val.field_2.vec3_val.z;
      val_00.field_2.int_val = right_val.field_2.int_val;
      val_00.type = right_val.type;
      val_00.is_return = right_val.is_return;
      val_00._5_3_ = right_val._5_3_;
      val_00.field_2.vec2_val.y = right_val.field_2.vec2_val.y;
      gs_eval_cast(&left_val,eval,val_00,(expr->field_2).cast.type);
      right_val.field_2.vec3_val.z = left_val.field_2.vec3_val.z;
      right_val.field_2._12_4_ = left_val.field_2._12_4_;
      right_val.is_return = left_val.is_return;
      right_val.type = left_val.type;
      right_val._5_2_ = left_val._5_2_;
      right_val._7_1_ = left_val._7_1_;
      right_val.field_2.int_val = left_val.field_2.int_val;
      right_val.field_2.vec2_val.y = left_val.field_2.vec2_val.y;
    }
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT44(right_val.field_2._12_4_,right_val.field_2.vec3_val.z);
LAB_00135e04:
    __return_storage_ptr__->type = right_val.type;
    __return_storage_ptr__->is_return = right_val.is_return;
    *(int3 *)&__return_storage_ptr__->field_0x5 = right_val._5_3_;
    (__return_storage_ptr__->field_2).int_val = right_val.field_2.int_val;
    (__return_storage_ptr__->field_2).vec2_val.y = right_val.field_2.vec2_val.y;
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_eval_expr(gs_eval_t *eval, gs_expr_t *expr) {
    gs_val_t val;
    switch (expr->type) {
        case GS_EXPR_BINARY_OP:
            val = gs_eval_expr_binary_op(eval, expr);
            break;
        case GS_EXPR_ASSIGNMENT:
            val = gs_eval_expr_assignment(eval, expr);
            break;
        case GS_EXPR_INT:
            val = gs_eval_expr_int(eval, expr);
            break;
        case GS_EXPR_FLOAT:
            val = gs_eval_expr_float(eval, expr);
            break;
        case GS_EXPR_SYMBOL:
            val = gs_eval_expr_symbol(eval, expr);
            break;
        case GS_EXPR_STRING:
            val = gs_eval_expr_string(eval, expr);
            break;
        case GS_EXPR_CALL:
            val = gs_eval_expr_call(eval, expr);
            break;
        case GS_EXPR_MEMBER_ACCESS:
            val = gs_eval_expr_member_access(eval, expr);
            break;
        case GS_EXPR_ARRAY_ACCESS:
            val = gs_eval_expr_array_access(eval, expr);
            break;
        case GS_EXPR_ARRAY_DECL:
            val = gs_eval_expr_array_decl(eval, expr);
            break;
        case GS_EXPR_CAST:
            val = gs_eval_expr_cast(eval, expr);
            break;
    }
    return val;
}